

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

void udp_send_disc_full(udp_ep *ep,nng_sockaddr *sa,uint32_t param_3,uint32_t remote_id,uint32_t seq
                       ,udp_disc_reason reason)

{
  undefined1 local_1c [8];
  udp_sp_disc disc;
  
  local_1c._0_2_ = 0x301;
  local_1c._2_2_ = ep->proto;
  disc.us_peer_id._0_2_ = (undefined2)reason;
  local_1c._4_4_ = param_3;
  disc._0_4_ = remote_id;
  disc.us_sender_id = seq;
  udp_queue_tx(ep,sa,(udp_sp_msg *)local_1c,(nni_msg *)0x0);
  return;
}

Assistant:

static void
udp_send_disc_full(udp_ep *ep, nng_sockaddr *sa, uint32_t local_id,
    uint32_t remote_id, uint32_t seq, udp_disc_reason reason)
{
	udp_sp_disc disc;

	disc.us_ver       = 0x1;
	disc.us_op_code   = OPCODE_DISC;
	disc.us_type      = ep->proto;
	disc.us_sender_id = local_id;
	disc.us_peer_id   = remote_id;
	disc.us_sequence  = seq;
	disc.us_reason    = (uint16_t) reason;
	udp_queue_tx(ep, sa, (void *) &disc, NULL);
}